

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_SelectWeapon
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  uint uVar1;
  PClass *pPVar2;
  byte bVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 extraout_var;
  AWeapon *pAVar7;
  undefined4 extraout_var_00;
  PClassActor *pPVar8;
  PClassActor *type;
  char *pcVar9;
  AActor *this;
  bool bVar10;
  PClass *pPVar6;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar9 = "(paramnum) < numparam";
    goto LAB_003d3e0a;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003d3df1:
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d3e0a:
    __assert_fail(pcVar9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc14,
                  "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_003d3c04;
    pPVar6 = (this->super_DThinker).super_DObject.Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar4 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar6 = (PClass *)CONCAT44(extraout_var,iVar4);
      (this->super_DThinker).super_DObject.Class = pPVar6;
    }
    bVar10 = pPVar6 != (PClass *)0x0;
    if (pPVar6 != pPVar2 && bVar10) {
      do {
        pPVar6 = pPVar6->ParentClass;
        bVar10 = pPVar6 != (PClass *)0x0;
        if (pPVar6 == pPVar2) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    if (!bVar10) {
      pcVar9 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d3e0a;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_003d3df1;
LAB_003d3c04:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar9 = "(paramnum) < numparam";
    goto LAB_003d3e29;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003d3dfa:
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d3e29:
    __assert_fail(pcVar9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc15,
                  "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  type = (PClassActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_003d3c65;
    pPVar8 = type;
    if (type != (PClassActor *)AWeapon::RegistrationInfo.MyClass) {
      do {
        pPVar8 = (PClassActor *)(pPVar8->super_PClass).ParentClass;
        if (pPVar8 == (PClassActor *)AWeapon::RegistrationInfo.MyClass) break;
      } while (pPVar8 != (PClassActor *)0x0);
      if (pPVar8 == (PClassActor *)0x0) {
        pcVar9 = "cls == NULL || cls->IsDescendantOf(RUNTIME_CLASS(AWeapon))";
        goto LAB_003d3e29;
      }
    }
    bVar3 = 0;
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_003d3dfa;
LAB_003d3c65:
    bVar3 = 1;
    type = (PClassActor *)0x0;
  }
  if (numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003d3e67;
    }
  }
  else if (param[2].field_0.field_3.Type != '\0') {
    pcVar9 = "(param[paramnum]).Type == REGT_INT";
LAB_003d3e67:
    __assert_fail(pcVar9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc16,
                  "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  uVar1 = param[2].field_0.i;
  if (((bool)(bVar3 & (uVar1 & 1) == 0)) || (this->player == (player_t *)0x0)) {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xc1c,
                    "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
LAB_003d3d67:
    if (ret->RegType != '\0') goto LAB_003d3e41;
    uVar5 = 0;
  }
  else {
    pAVar7 = (AWeapon *)AActor::FindInventory(this,type,false);
    pPVar2 = AWeapon::RegistrationInfo.MyClass;
    if (pAVar7 == (AWeapon *)0x0) {
LAB_003d3d75:
      if ((uVar1 & 1) == 0) {
        if (numret < 1) {
          return 0;
        }
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0xc33,
                        "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        goto LAB_003d3d67;
      }
      APlayerPawn::PickNewWeapon(this->player->mo,(PClassAmmo *)0x0);
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0xc2f,
                      "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
    }
    else {
      pPVar6 = (pAVar7->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
               super_DObject.Class;
      if (pPVar6 == (PClass *)0x0) {
        iVar4 = (**(pAVar7->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                   super_DObject._vptr_DObject)(pAVar7);
        pPVar6 = (PClass *)CONCAT44(extraout_var_00,iVar4);
        (pAVar7->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.
        Class = pPVar6;
      }
      bVar10 = pPVar6 != (PClass *)0x0;
      if (pPVar6 != pPVar2 && bVar10) {
        do {
          pPVar6 = pPVar6->ParentClass;
          bVar10 = pPVar6 != (PClass *)0x0;
          if (pPVar6 == pPVar2) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      if (!bVar10) goto LAB_003d3d75;
      if (this->player->ReadyWeapon != pAVar7) {
        this->player->PendingWeapon = pAVar7;
      }
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0xc27,
                      "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
    }
    uVar5 = 1;
    if (ret->RegType != '\0') {
LAB_003d3e41:
      __assert_fail("RegType == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                    ,0x13f,"void VMReturn::SetInt(int)");
    }
  }
  *(undefined4 *)ret->Location = uVar5;
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SelectWeapon)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(cls, AWeapon);
	PARAM_INT_DEF(flags);

	bool selectPriority = !!(flags & SWF_SELECTPRIORITY);

	if ((!selectPriority && cls == NULL) || self->player == NULL)
	{
		ACTION_RETURN_BOOL(false);
	}

	AWeapon *weaponitem = static_cast<AWeapon*>(self->FindInventory(cls));

	if (weaponitem != NULL && weaponitem->IsKindOf(RUNTIME_CLASS(AWeapon)))
	{
		if (self->player->ReadyWeapon != weaponitem)
		{
			self->player->PendingWeapon = weaponitem;
		}
		ACTION_RETURN_BOOL(true);
	}
	else if (selectPriority)
	{
		// [XA] if the named weapon cannot be found (or is a dummy like 'None'),
		//      select the next highest priority weapon. This is basically
		//      the same as A_CheckReload minus the ammo check. Handy.
		self->player->mo->PickNewWeapon(NULL);
		ACTION_RETURN_BOOL(true);
	}
	else
	{
		ACTION_RETURN_BOOL(false);
	}
}